

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

optional<wasm::WATParser::(anonymous_namespace)::LexResult> *
wasm::WATParser::anon_unknown_0::space
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          string_view in)

{
  bool *this;
  char *pcVar1;
  size_t sVar2;
  void *pvVar3;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> *poVar4;
  char *in_RCX;
  size_t depth;
  long lVar5;
  anon_unknown_0 *paVar6;
  anon_unknown_0 *this_00;
  anon_unknown_0 *paVar7;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view sv_03;
  string_view in_00;
  undefined1 local_78 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed;
  anon_unknown_0 *local_50;
  
  paVar6 = (anon_unknown_0 *)in._M_len;
  if (paVar6 == (anon_unknown_0 *)0x0) {
    poVar4 = (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)0x0;
  }
  else {
    paVar7 = (anon_unknown_0 *)0x0;
    this = &lexed.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
            _M_engaged;
    this_00 = paVar6;
    do {
      if (paVar6 < paVar7) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   paVar7,paVar6);
      }
      pcVar1 = in._M_str + (long)paVar7;
      in_00._M_str = in_RCX;
      in_00._M_len = (size_t)pcVar1;
      spacechar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_78,this_00,
                in_00);
      local_50 = (anon_unknown_0 *)local_78;
      if (lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._8_1_ != '\x01') {
        if (this_00 == (anon_unknown_0 *)0x1) break;
        sv._M_str = ";;@";
        sv._M_len = 3;
        lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _16_8_ = this_00;
        sVar2 = LexCtx::startsWith((LexCtx *)this,sv);
        if ((sVar2 == 0) &&
           (sv_03._M_str = ";;", sv_03._M_len = 2, sVar2 = LexCtx::startsWith((LexCtx *)this,sv_03),
           sVar2 != 0)) {
          if (this_00 + -2 == (anon_unknown_0 *)0x0) {
            local_50 = (anon_unknown_0 *)0x2;
          }
          else {
            pvVar3 = memchr(pcVar1 + 2,10,(size_t)(this_00 + -2));
            in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),pvVar3 == (void *)0x0);
            lVar5 = (long)pvVar3 - (long)(pcVar1 + 2);
            local_50 = this_00;
            if (lVar5 != -1 && pvVar3 != (void *)0x0) {
              local_50 = (anon_unknown_0 *)(lVar5 + 2);
              goto joined_r0x00b7cde9;
            }
          }
        }
        else {
          sv_00._M_str = "(;";
          sv_00._M_len = 2;
          sVar2 = LexCtx::startsWith((LexCtx *)this,sv_00);
          if (sVar2 == 0) break;
          local_50 = (anon_unknown_0 *)0x2;
          lVar5 = 1;
          do {
            if ((ulong)((long)this_00 - (long)local_50) < 2) goto LAB_00b7cdf9;
            sv_01._M_str = "(;";
            sv_01._M_len = 2;
            sVar2 = LexCtx::startsWith((LexCtx *)this,sv_01);
            if (sVar2 == 0) {
              sv_02._M_str = ";)";
              sv_02._M_len = 2;
              sVar2 = LexCtx::startsWith((LexCtx *)this,sv_02);
              if (sVar2 == 0) {
                local_50 = local_50 + 1;
              }
              else {
                local_50 = local_50 + 2;
                lVar5 = lVar5 + -1;
              }
            }
            else {
              local_50 = local_50 + 2;
              lVar5 = lVar5 + 1;
            }
          } while (lVar5 != 0);
joined_r0x00b7cde9:
          if (local_50 == (anon_unknown_0 *)0x0) break;
        }
        if (this_00 < local_50) {
          local_50 = this_00;
        }
      }
      paVar7 = paVar7 + (long)local_50;
      this_00 = paVar6 + -(long)paVar7;
    } while (this_00 != (anon_unknown_0 *)0x0);
LAB_00b7cdf9:
    if (paVar7 == (anon_unknown_0 *)0x0) {
      poVar4 = (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)0x0;
    }
    else {
      if (paVar6 < paVar7) {
        paVar7 = paVar6;
      }
      (__return_storage_ptr__->
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>).
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_payload._M_value.span._M_len = (size_t)paVar7;
      (__return_storage_ptr__->
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>).
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_payload._M_value.span._M_str = in._M_str;
      poVar4 = (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
               CONCAT71(in._M_str._1_7_,1);
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_engaged =
       SUB81(poVar4,0);
  return poVar4;
}

Assistant:

std::optional<LexResult> space(std::string_view in) {
  LexCtx ctx(in);
  while (ctx.size()) {
    if (auto lexed = spacechar(ctx.next())) {
      ctx.take(*lexed);
    } else if (auto lexed = comment(ctx.next())) {
      ctx.take(*lexed);
    } else {
      break;
    }
  }
  return ctx.lexed();
}